

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

uint32 __thiscall
Protocol::MQTT::V5::FixedField<(Protocol::MQTT::Common::ControlPacketType)14>::readFrom
          (FixedField<(Protocol::MQTT::Common::ControlPacketType)14> *this,uint8 *buffer,
          uint32 bufLength)

{
  uint uVar1;
  uint uVar2;
  
  if ((this->super_FixedFieldWithReason).super_FixedFieldWithRemainingLength.remLength == 0) {
    (this->super_FixedFieldWithReason).reasonCode.value = '\0';
    uVar1 = 0xfffffffd;
  }
  else {
    uVar1 = FixedFieldGeneric::readFrom((FixedFieldGeneric *)this,buffer,bufLength);
  }
  uVar2 = 0xfffffffd;
  if ((this->super_FixedFieldWithReason).super_FixedFieldWithRemainingLength.remLength != 1) {
    uVar2 = uVar1;
  }
  if (0xfffffffc < uVar1) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    uint32 r = FixedFieldWithReason::readFrom(buffer, bufLength);
                    if (!isError(r) && remLength == 1) return Shortcut;
                    return r;
                }